

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

void __thiscall
google::protobuf::SplitStringUsing
          (protobuf *this,StringPiece full,char *delim,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *result)

{
  protobuf pVar1;
  size_type pos;
  size_type pos_00;
  protobuf *ppVar2;
  char c;
  protobuf *ppVar3;
  protobuf *ppVar4;
  string local_a0;
  StringPiece local_80;
  StringPiece local_70;
  StringPiece local_60;
  StringPiece local_50;
  StringPiece local_40;
  
  ppVar4 = (protobuf *)full.length_;
  local_70.length_ = (size_type)full.ptr_;
  pVar1 = *ppVar4;
  local_70.ptr_ = (char *)this;
  if ((pVar1 == (protobuf)0x0) || (ppVar4[1] != (protobuf)0x0)) {
    stringpiece_internal::StringPiece::StringPiece(&local_40,(char *)ppVar4);
    pos = stringpiece_internal::StringPiece::find_first_not_of(&local_70,local_40,0);
    while (pos != 0xffffffffffffffff) {
      stringpiece_internal::StringPiece::StringPiece(&local_50,(char *)ppVar4);
      pos_00 = stringpiece_internal::StringPiece::find_first_of(&local_70,local_50,pos);
      if (pos_00 == 0xffffffffffffffff) {
        local_80 = stringpiece_internal::StringPiece::substr(&local_70,pos,0xffffffffffffffff);
        stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_a0,&local_80);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)delim,
                   &local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        return;
      }
      local_80 = stringpiece_internal::StringPiece::substr(&local_70,pos,pos_00 - pos);
      stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_a0,&local_80);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)delim,
                 &local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      stringpiece_internal::StringPiece::StringPiece(&local_60,(char *)ppVar4);
      pos = stringpiece_internal::StringPiece::find_first_not_of(&local_70,local_60,pos_00);
    }
  }
  else {
    ppVar4 = (protobuf *)(local_70.length_ + (long)this);
    while (this != ppVar4) {
      ppVar2 = this;
      if (*this == pVar1) {
        this = this + 1;
      }
      else {
        do {
          ppVar2 = ppVar2 + 1;
          ppVar3 = ppVar4;
          if (ppVar2 == ppVar4) break;
          ppVar3 = ppVar2;
        } while (*ppVar2 != pVar1);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,this,ppVar3);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)delim,
                   &local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        this = ppVar3;
      }
    }
  }
  return;
}

Assistant:

void SplitStringUsing(StringPiece full, const char *delim,
                      std::vector<std::string> *result) {
  std::back_insert_iterator<std::vector<std::string> > it(*result);
  SplitStringToIteratorUsing(full, delim, it);
}